

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void unodb::detail::
     basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
     ::dump_node(ostream *os,basic_node_ptr<unodb::detail::node_header> *node,bool recursive)

{
  bool bVar1;
  node_type nVar2;
  ostream *poVar3;
  void *pvVar4;
  uintptr_t uVar5;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_00;
  basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_01;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_02;
  basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_03;
  bool recursive_local;
  basic_node_ptr<unodb::detail::node_header> *node_local;
  ostream *os_local;
  
  poVar3 = std::operator<<(os,"node at: ");
  pvVar4 = basic_node_ptr<unodb::detail::node_header>::ptr<void*>(node);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4);
  poVar3 = std::operator<<(poVar3,", tagged ptr = 0x");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
  uVar5 = basic_node_ptr<unodb::detail::node_header>::raw_val(node);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,uVar5);
  std::ostream::operator<<(pvVar4,std::dec);
  bVar1 = basic_node_ptr<unodb::detail::node_header>::operator==(node,(nullptr_t)0x0);
  if (bVar1) {
    std::operator<<(os,'\n');
  }
  else {
    std::operator<<(os,", type = ");
    nVar2 = basic_node_ptr<unodb::detail::node_header>::type(node);
    switch(nVar2) {
    case LEAF:
      std::operator<<(os,"LEAF");
      this = basic_node_ptr<unodb::detail::node_header>::
             ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>(node);
      basic_leaf<unsigned_long,_unodb::detail::node_header>::dump(this,os,recursive);
      break;
    case I4:
      std::operator<<(os,"I4");
      this_00 = &basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                           (node)->super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>;
      basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::dump(this_00,os,recursive);
      break;
    case I16:
      std::operator<<(os,"I16");
      this_01 = &basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                           (node)->super_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>
      ;
      basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::dump(this_01,os,recursive);
      break;
    case I48:
      std::operator<<(os,"I48");
      this_02 = &basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                           (node)->super_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>
      ;
      basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::dump(this_02,os,recursive);
      break;
    case I256:
      std::operator<<(os,"I256");
      this_03 = &basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                           (node)->
                 super_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>;
      basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::dump(this_03,os,recursive);
    }
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE static void dump_node(
      std::ostream &os, const NodePtr &node, bool recursive = true) {
    os << "node at: " << node.template ptr<void *>() << ", tagged ptr = 0x"
       << std::hex << node.raw_val() << std::dec;
    if (node == nullptr) {
      os << '\n';
      return;
    }
    os << ", type = ";
    switch (node.type()) {
      case node_type::LEAF:
        os << "LEAF";
        node.template ptr<leaf_type *>()->dump(os, recursive);
        break;
      case node_type::I4:
        os << "I4";
        node.template ptr<inode4_type *>()->dump(os, recursive);
        break;
      case node_type::I16:
        os << "I16";
        node.template ptr<inode16_type *>()->dump(os, recursive);
        break;
      case node_type::I48:
        os << "I48";
        node.template ptr<inode48_type *>()->dump(os, recursive);
        break;
      case node_type::I256:
        os << "I256";
        node.template ptr<inode256_type *>()->dump(os, recursive);
        break;
    }
  }